

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

int Sfm_LibFindDelayMatches
              (Sfm_Lib_t *p,word *pTruth,int *pFanins,int nFanins,Vec_Ptr_t *vGates,Vec_Ptr_t *vFans
              )

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  void **ppvVar8;
  long lVar9;
  int iVar10;
  void *pvVar11;
  Sfm_Fun_t *pSVar12;
  Mio_Cell2_t *pMVar13;
  char *pcVar14;
  word pCopy [4];
  word local_58;
  word wStack_50;
  word local_48;
  word wStack_40;
  
  if (6 < nFanins) {
    local_58 = *pTruth;
    wStack_50 = pTruth[1];
    local_48 = pTruth[2];
    wStack_40 = pTruth[3];
    Dau_DsdPrintFromTruth(&local_58,p->nVars);
  }
  vGates->nSize = 0;
  vFans->nSize = 0;
  iVar10 = p->nWords;
  lVar5 = (long)iVar10;
  if (0 < lVar5) {
    lVar9 = 0;
    do {
      if (pTruth[lVar9] != 0) {
        if (0 < iVar10) {
          lVar9 = 0;
          goto LAB_0052899a;
        }
        break;
      }
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  goto LAB_005289f1;
  while (lVar9 = lVar9 + 1, lVar5 != lVar9) {
LAB_0052899a:
    if (pTruth[lVar9] != 0xffffffffffffffff) {
      if (0 < iVar10) {
        lVar9 = 0;
        goto LAB_005289bf;
      }
      break;
    }
  }
  goto LAB_005289f1;
  while (lVar9 = lVar9 + 8, lVar5 << 3 != lVar9) {
LAB_005289bf:
    if (*(long *)((long)pTruth + lVar9) != *(long *)((long)s_Truth8[0] + lVar9)) {
      if (0 < iVar10) {
        lVar9 = 0;
        goto LAB_005289da;
      }
      break;
    }
  }
  goto LAB_005289f1;
LAB_00528a59:
  if ((long)iVar10 == -1) {
    pSVar12 = (Sfm_Fun_t *)0x0;
  }
  else {
    pSVar12 = p->pObjs + iVar10;
  }
  if (pSVar12 == (Sfm_Fun_t *)0x0) {
    return vGates->nSize / 2;
  }
  pMVar13 = p->pCells;
  cVar2 = pSVar12->pFansT[0];
  pvVar11 = pMVar13[pSVar12->pFansB[0]].pMioGate;
  uVar4 = vGates->nCap;
  if (vGates->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vGates->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(vGates->pArray,0x80);
      }
      vGates->pArray = ppvVar8;
      iVar10 = 0x10;
    }
    else {
      iVar10 = uVar4 * 2;
      if (iVar10 <= (int)uVar4) goto LAB_00528b13;
      if (vGates->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(vGates->pArray,(ulong)uVar4 << 4);
      }
      vGates->pArray = ppvVar8;
    }
    vGates->nCap = iVar10;
  }
LAB_00528b13:
  pMVar13 = pMVar13 + cVar2;
  iVar10 = vGates->nSize;
  uVar4 = iVar10 + 1;
  vGates->nSize = uVar4;
  vGates->pArray[iVar10] = pvVar11;
  if (pMVar13 == p->pCells) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = pMVar13->pMioGate;
  }
  uVar3 = vGates->nCap;
  if (uVar4 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vGates->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(vGates->pArray,0x80);
      }
      iVar10 = 0x10;
    }
    else {
      iVar10 = uVar3 * 2;
      if (iVar10 <= (int)uVar3) goto LAB_00528b9e;
      if (vGates->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(vGates->pArray,(ulong)uVar3 << 4);
      }
    }
    vGates->pArray = ppvVar8;
    vGates->nCap = iVar10;
  }
LAB_00528b9e:
  iVar10 = vGates->nSize;
  vGates->nSize = iVar10 + 1;
  vGates->pArray[iVar10] = pvVar11;
  uVar4 = vFans->nCap;
  if (vFans->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vFans->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(vFans->pArray,0x80);
      }
      vFans->pArray = ppvVar8;
      iVar10 = 0x10;
    }
    else {
      iVar10 = uVar4 * 2;
      if (iVar10 <= (int)uVar4) goto LAB_00528c26;
      if (vFans->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(vFans->pArray,(ulong)uVar4 << 4);
      }
      vFans->pArray = ppvVar8;
    }
    vFans->nCap = iVar10;
  }
LAB_00528c26:
  iVar10 = vFans->nSize;
  uVar4 = iVar10 + 1;
  vFans->nSize = uVar4;
  vFans->pArray[iVar10] = pSVar12->pFansB + 1;
  pcVar14 = (char *)0x0;
  if (pMVar13 != p->pCells) {
    pcVar14 = pSVar12->pFansT + 1;
  }
  uVar3 = vFans->nCap;
  if (uVar4 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vFans->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(vFans->pArray,0x80);
      }
      iVar10 = 0x10;
    }
    else {
      iVar10 = uVar3 * 2;
      if (iVar10 <= (int)uVar3) goto LAB_00528cac;
      if (vFans->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(vFans->pArray,(ulong)uVar3 << 4);
      }
    }
    vFans->pArray = ppvVar8;
    vFans->nCap = iVar10;
  }
LAB_00528cac:
  iVar10 = vFans->nSize;
  vFans->nSize = iVar10 + 1;
  vFans->pArray[iVar10] = pcVar14;
  iVar10 = pSVar12->Next;
  goto LAB_00528a59;
  while (lVar9 = lVar9 + 8, lVar5 << 3 != lVar9) {
LAB_005289da:
    if ((*(ulong *)((long)s_Truth8[0] + lVar9) ^ *(ulong *)((long)pTruth + lVar9)) !=
        0xffffffffffffffff) {
      puVar6 = (uint *)Vec_MemHashLookup(p->vTtMem,pTruth);
      uVar4 = *puVar6;
      uVar7 = (ulong)uVar4;
      if (uVar7 == 0xffffffff) {
        if ((nFanins < 7) && (p->fVerbose == 0)) {
          return 0;
        }
        printf("Not found in the precomputed library: ");
        Dau_DsdPrintFromTruth(pTruth,nFanins);
        return 0;
      }
      if (((int)uVar4 < 0) || ((p->vHits).nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (p->vHits).pArray + uVar7;
      *piVar1 = *piVar1 + 1;
      if ((p->vLists).nSize <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = (p->vLists).pArray[uVar7];
      goto LAB_00528a59;
    }
  }
LAB_005289f1:
  __assert_fail("!Abc_TtIsConst0(pTruth, p->nWords) && !Abc_TtIsConst1(pTruth, p->nWords) && !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                ,0x282,
                "int Sfm_LibFindDelayMatches(Sfm_Lib_t *, word *, int *, int, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

int Sfm_LibFindDelayMatches( Sfm_Lib_t * p, word * pTruth, int * pFanins, int nFanins, Vec_Ptr_t * vGates, Vec_Ptr_t * vFans )
{
    Sfm_Fun_t * pObj;
    Mio_Cell2_t * pCellB, * pCellT;
    int iFunc;
    if ( nFanins > 6 )
    {
        word pCopy[4];
        Abc_TtCopy( pCopy, pTruth, 4, 0 );
        Dau_DsdPrintFromTruth( pCopy, p->nVars );
    }
    Vec_PtrClear( vGates );
    Vec_PtrClear( vFans );
    // look for gate
    assert( !Abc_TtIsConst0(pTruth, p->nWords) && 
            !Abc_TtIsConst1(pTruth, p->nWords) && 
            !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && 
            !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords) );
    iFunc = *Vec_MemHashLookup( p->vTtMem,  pTruth );
    if ( iFunc == -1 )
    {
        // print functions not found in the library
        if ( p->fVerbose || nFanins > 6 )
        {
            printf( "Not found in the precomputed library: " );
            Dau_DsdPrintFromTruth( pTruth, nFanins );
        }
        return 0;
    }
    Vec_IntAddToEntry( &p->vHits, iFunc, 1 );
    // collect matches
    Sfm_LibForEachSuper( p, pObj, iFunc )
    {
        pCellB = p->pCells + (int)pObj->pFansB[0];
        pCellT = p->pCells + (int)pObj->pFansT[0];
        Vec_PtrPush( vGates, pCellB->pMioGate );
        Vec_PtrPush( vGates, pCellT == p->pCells ? NULL : pCellT->pMioGate );
        Vec_PtrPush( vFans, pObj->pFansB + 1 );
        Vec_PtrPush( vFans, pCellT == p->pCells ? NULL : pObj->pFansT + 1 );
    }
    return Vec_PtrSize(vGates) / 2;
}